

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-feeder-c-impl.h
# Opt level: O3

void __thiscall
mp::NLW2_NLFeeder_C_Impl::
FeedConBounds<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,mp::NLW2_NLFeeder_C_Impl>>::ConBndWriter>
          (NLW2_NLFeeder_C_Impl *this,ConBndWriter *crw)

{
  ConBndWriter *local_28;
  undefined8 local_20;
  code *local_18;
  code *local_10;
  
  local_20 = 0;
  local_10 = std::
             _Function_handler<void_(NLW2_AlgConRange_C_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/include/api/c/nl-feeder-c-impl.h:248:11)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(NLW2_AlgConRange_C_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/include/api/c/nl-feeder-c-impl.h:248:11)>
             ::_M_manager;
  local_28 = crw;
  (*(this->nlf2_c_).FeedConBounds)((this->nlf2_c_).p_user_data_,&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,3);
  }
  return;
}

Assistant:

void FeedConBounds(ConBoundsWriter& crw) {
    assert(NLF().FeedConBounds);
    std::function<void(NLW2_AlgConRange_C* )> crw_c
        = [&crw](NLW2_AlgConRange_C* bnd_c){
      AlgConRange bnd;
      bnd.k = bnd_c->k;
      bnd.cvar = bnd_c->cvar;
      bnd.L = bnd_c->L;
      bnd.U = bnd_c->U;
      crw.WriteAlgConRange(bnd);
    };
    NLF().FeedConBounds(NLF().p_user_data_, &crw_c);
  }